

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_table.c
# Opt level: O1

uint32_t lyht_hash_multi(uint32_t hash,char *key_part,size_t len)

{
  uint uVar1;
  ulong uVar2;
  
  if (len != 0 && key_part != (char *)0x0) {
    uVar2 = 0;
    do {
      uVar1 = ((int)key_part[uVar2] + hash) * 0x401;
      hash = uVar1 >> 6 ^ uVar1;
      uVar2 = uVar2 + 1;
    } while ((uVar2 & 0xffffffff) < len);
    return hash;
  }
  return (hash * 9 >> 0xb ^ hash * 9) * 0x8001;
}

Assistant:

LIBYANG_API_DEF uint32_t
lyht_hash_multi(uint32_t hash, const char *key_part, size_t len)
{
    uint32_t i;

    if (key_part && len) {
        for (i = 0; i < len; ++i) {
            hash += key_part[i];
            hash += (hash << 10);
            hash ^= (hash >> 6);
        }
    } else {
        hash += (hash << 3);
        hash ^= (hash >> 11);
        hash += (hash << 15);
    }

    return hash;
}